

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::makePointer(Builder *this,StorageClass storageClass,Id pointee)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  StorageClass *pSVar3;
  iterator __position;
  iterator __position_00;
  Id IVar4;
  Instruction *pIVar5;
  uint uVar6;
  ulong uVar7;
  _Head_base<0UL,_spv::Instruction_*,_false> local_40;
  Instruction *local_38;
  
  ppIVar2 = this->groupedTypes[0x20].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)this->groupedTypes[0x20].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  if (0 < (int)uVar6) {
    uVar7 = 0;
    do {
      local_38 = ppIVar2[uVar7];
      pSVar3 = (local_38->operands).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((*pSVar3 == storageClass) && (pSVar3[1] == pointee)) goto LAB_001b1250;
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  pIVar5 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar4 = this->uniqueId + 1;
  this->uniqueId = IVar4;
  pIVar5->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  pIVar5->resultId = IVar4;
  pIVar5->typeId = 0;
  pIVar5->opCode = OpTypePointer;
  (pIVar5->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar5->operands).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar5->block = (Block *)0x0;
  local_38 = pIVar5;
  local_40._M_head_impl._0_4_ = storageClass;
  std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
  _M_realloc_insert<unsigned_int_const&>
            ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)&pIVar5->operands,
             (iterator)0x0,(uint *)&local_40);
  __position._M_current =
       (pIVar5->operands).
       super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_40._M_head_impl._0_4_ = pointee;
  if (__position._M_current ==
      (pIVar5->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
    _M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
               &pIVar5->operands,__position,(uint *)&local_40);
  }
  else {
    *__position._M_current = pointee;
    (pIVar5->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  __position_00._M_current =
       this->groupedTypes[0x20].
       super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      this->groupedTypes[0x20].
      super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
    _M_realloc_insert<spv::Instruction*const&>
              ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
               (this->groupedTypes + 0x20),__position_00,&local_38);
    local_40._M_head_impl = local_38;
  }
  else {
    *__position_00._M_current = pIVar5;
    pppIVar1 = &this->groupedTypes[0x20].
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
    local_40._M_head_impl = pIVar5;
  }
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_40);
  if (local_40._M_head_impl != (Instruction *)0x0) {
    (*(local_40._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,local_38);
LAB_001b1250:
  return local_38->resultId;
}

Assistant:

Id Builder::makePointer(StorageClass storageClass, Id pointee)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypePointer].size(); ++t) {
        type = groupedTypes[OpTypePointer][t];
        if (type->getImmediateOperand(0) == (unsigned)storageClass &&
            type->getIdOperand(1) == pointee)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypePointer);
    type->addImmediateOperand(storageClass);
    type->addIdOperand(pointee);
    groupedTypes[OpTypePointer].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}